

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O1

void __thiscall
QStandardItemPrivate::sortChildren(QStandardItemPrivate *this,int column,SortOrder order)

{
  QList<QStandardItem_*> *this_00;
  int iVar1;
  QStandardItem *pQVar2;
  QStandardItemPrivate *pQVar3;
  QAbstractItemModel *pQVar4;
  iterator __seed;
  iterator iVar5;
  long lVar6;
  pointer ppQVar7;
  iterator iVar8;
  iterator iVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  QStandardItem *pQVar15;
  uint uVar16;
  long in_FS_OFFSET;
  Bucket BVar17;
  QStandardItem *itm;
  QModelIndex local_118;
  QModelIndex local_f8;
  QArrayDataPointer<QStandardItem_*> local_d8;
  QList<QModelIndex> local_b8;
  QList<int> local_98;
  QList<std::pair<QStandardItem_*,_int>_> local_78;
  _Temporary_buffer<QList<std::pair<QStandardItem_*,_int>_>::iterator,_std::pair<QStandardItem_*,_int>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->columns <= column) goto LAB_00550cdf;
  pQVar2 = this->q_ptr;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (pair<QStandardItem_*,_int> *)0x0;
  uVar16 = 0;
  local_78.d.size = 0;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (int *)0x0;
  local_98.d.size = 0;
  QList<std::pair<QStandardItem_*,_int>_>::reserve(&local_78,(long)this->rows);
  QList<int>::reserve(&local_98,(long)this->rows);
  local_d8.d = (Data *)((ulong)local_d8.d._4_4_ << 0x20);
  if (0 < this->rows) {
    do {
      pQVar3 = (pQVar2->d_ptr).d;
      iVar11 = -1;
      if (((-1 < (int)(uVar16 | column)) && ((int)uVar16 < pQVar3->rows)) &&
         (column < pQVar3->columns)) {
        iVar11 = pQVar3->columns * uVar16 + column;
      }
      if (iVar11 == -1) {
        local_58._M_original_len = 0;
      }
      else {
        local_58._M_original_len = (size_type_conflict1)(pQVar3->children).d.ptr[iVar11];
      }
      if ((QArrayData *)local_58._M_original_len == (QArrayData *)0x0) {
        local_b8.d.d = (Data *)CONCAT44(local_b8.d.d._4_4_,uVar16);
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)&local_98,local_98.d.size,(int *)&local_b8);
        QList<int>::end(&local_98);
      }
      else {
        QtPrivate::QPodArrayOps<std::pair<QStandardItem*,int>>::emplace<QStandardItem*&,int&>
                  ((QPodArrayOps<std::pair<QStandardItem*,int>> *)&local_78,local_78.d.size,
                   (QStandardItem **)&local_58,(int *)&local_d8);
        QList<std::pair<QStandardItem_*,_int>_>::end(&local_78);
      }
      uVar16 = (int)local_d8.d + 1;
      local_d8.d = (Data *)CONCAT44(local_d8.d._4_4_,uVar16);
    } while ((int)uVar16 < this->rows);
  }
  __seed = QList<std::pair<QStandardItem_*,_int>_>::begin(&local_78);
  iVar5 = QList<std::pair<QStandardItem_*,_int>_>::end(&local_78);
  if (order == AscendingOrder) {
    if (__seed.i != iVar5.i) {
      lVar6 = (long)iVar5.i - (long)__seed.i >> 4;
      local_58._M_buffer = (pointer)&DAT_aaaaaaaaaaaaaaaa;
      local_58._M_original_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
      local_58._M_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
      std::
      _Temporary_buffer<QList<std::pair<QStandardItem_*,_int>_>::iterator,_std::pair<QStandardItem_*,_int>_>
      ::_Temporary_buffer(&local_58,__seed,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
      if (local_58._M_buffer == (pointer)0x0) {
        std::
        __inplace_stable_sort<QList<std::pair<QStandardItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemModelLessThan>>
                  (__seed.i,iVar5.i);
      }
      else {
        std::
        __stable_sort_adaptive<QList<std::pair<QStandardItem*,int>>::iterator,std::pair<QStandardItem*,int>*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemModelLessThan>>
                  (__seed.i,iVar5.i,local_58._M_buffer,local_58._M_len);
      }
      goto LAB_00550962;
    }
  }
  else if (__seed.i != iVar5.i) {
    lVar6 = (long)iVar5.i - (long)__seed.i >> 4;
    local_58._M_buffer = (pointer)&DAT_aaaaaaaaaaaaaaaa;
    local_58._M_original_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
    local_58._M_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
    std::
    _Temporary_buffer<QList<std::pair<QStandardItem_*,_int>_>::iterator,_std::pair<QStandardItem_*,_int>_>
    ::_Temporary_buffer(&local_58,__seed,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
    if (local_58._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<QList<std::pair<QStandardItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemModelGreaterThan>>
                (__seed.i,iVar5.i);
    }
    else {
      std::
      __stable_sort_adaptive<QList<std::pair<QStandardItem*,int>>::iterator,std::pair<QStandardItem*,int>*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<QStandardItemModelGreaterThan>>
                (__seed.i,iVar5.i,local_58._M_buffer,local_58._M_len);
    }
LAB_00550962:
    operator_delete(local_58._M_buffer,local_58._M_len << 4);
  }
  local_58._M_original_len = 0;
  local_58._M_len = 0;
  local_58._M_buffer = (pointer)0x0;
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (QModelIndex *)0x0;
  local_b8.d.size = 0;
  this_00 = &this->children;
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QStandardItem **)&DAT_aaaaaaaaaaaaaaaa;
  QList<QStandardItem_*>::QList((QList<QStandardItem_*> *)&local_d8,(this->children).d.size);
  if (0 < this->rows) {
    uVar12 = 0;
    do {
      piVar10 = &local_78.d.ptr[uVar12].second;
      if ((ulong)local_78.d.size <= uVar12) {
        piVar10 = local_98.d.ptr + (uVar12 - local_78.d.size);
      }
      iVar11 = this->columns;
      if (0 < iVar11) {
        iVar1 = *piVar10;
        iVar13 = 0;
        do {
          pQVar3 = (pQVar2->d_ptr).d;
          iVar14 = -1;
          if (((-1 < iVar1) && (iVar1 < pQVar3->rows)) && (iVar13 < pQVar3->columns)) {
            iVar14 = pQVar3->columns * iVar1 + iVar13;
          }
          if (iVar14 == -1) {
            pQVar15 = (QStandardItem *)0x0;
          }
          else {
            pQVar15 = (pQVar3->children).d.ptr[iVar14];
          }
          lVar6 = (long)(iVar11 * (int)uVar12 + iVar13);
          if ((long)this->rows <= (long)uVar12) {
            lVar6 = -1;
          }
          ppQVar7 = QList<QStandardItem_*>::data((QList<QStandardItem_*> *)&local_d8);
          ppQVar7[lVar6] = pQVar15;
          pQVar4 = &this->model->super_QAbstractItemModel;
          if (pQVar4 != (QAbstractItemModel *)0x0) {
            local_f8.c = iVar13;
            local_f8.r = iVar1;
            local_118.c = iVar13;
            local_118.r = iVar1;
            local_118.i = (quintptr)pQVar2;
            local_118.m.ptr = pQVar4;
            local_f8.i = (quintptr)pQVar2;
            local_f8.m.ptr = pQVar4;
            if (*(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  **)(*(long *)(pQVar4 + 8) + 0x90) !=
                (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                 *)0x0) {
              BVar17 = QHashPrivate::
                       Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                       ::findBucket<QtPrivate::QModelIndexWrapper>
                                 (*(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                                    **)(*(long *)(pQVar4 + 8) + 0x90),
                                  (QModelIndexWrapper *)&local_118);
              if ((BVar17.span[BVar17.index] != (Span)0xff) && (*(long *)(BVar17.span + 0x80) != 0))
              {
                local_118.m.ptr = &this->model->super_QAbstractItemModel;
                local_118.r = (int)uVar12;
                local_118.i = (quintptr)pQVar2;
                QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                          ((QMovableArrayOps<QModelIndex> *)&local_58,(qsizetype)local_58._M_buffer,
                           &local_f8);
                QList<QModelIndex>::end((QList<QModelIndex> *)&local_58);
                QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                          ((QMovableArrayOps<QModelIndex> *)&local_b8,local_b8.d.size,&local_118);
                QList<QModelIndex>::end(&local_b8);
              }
            }
          }
          iVar13 = iVar13 + 1;
          iVar11 = this->columns;
        } while (iVar13 < iVar11);
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)this->rows);
  }
  QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_d8);
  if (this->model != (QStandardItemModel *)0x0) {
    QAbstractItemModel::changePersistentIndexList
              ((QList_conflict *)this->model,(QList_conflict *)&local_58);
  }
  iVar8 = QList<QStandardItem_*>::begin(this_00);
  iVar9 = QList<QStandardItem_*>::end(this_00);
  if (iVar8.i != iVar9.i) {
    do {
      if (*iVar8.i != (QStandardItem *)0x0) {
        sortChildren(((*iVar8.i)->d_ptr).d,column,order);
      }
      iVar8.i = iVar8.i + 1;
      iVar9 = QList<QStandardItem_*>::end(this_00);
    } while (iVar8.i != iVar9.i);
  }
  if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d)->super_QArrayData,8,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  if ((QArrayData *)local_58._M_original_len != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate((QArrayData *)local_58._M_original_len,0x18,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x10,0x10);
    }
  }
LAB_00550cdf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStandardItemPrivate::sortChildren(int column, Qt::SortOrder order)
{
    Q_Q(QStandardItem);
    if (column >= columnCount())
        return;

    QList<std::pair<QStandardItem*, int> > sortable;
    QList<int> unsortable;

    sortable.reserve(rowCount());
    unsortable.reserve(rowCount());

    for (int row = 0; row < rowCount(); ++row) {
        QStandardItem *itm = q->child(row, column);
        if (itm)
            sortable.emplace_back(itm, row);
        else
            unsortable.append(row);
    }

    if (order == Qt::AscendingOrder) {
        QStandardItemModelLessThan lt;
        std::stable_sort(sortable.begin(), sortable.end(), lt);
    } else {
        QStandardItemModelGreaterThan gt;
        std::stable_sort(sortable.begin(), sortable.end(), gt);
    }

    QModelIndexList changedPersistentIndexesFrom, changedPersistentIndexesTo;
    QList<QStandardItem*> sorted_children(children.size());
    for (int i = 0; i < rowCount(); ++i) {
        int r = (i < sortable.size()
                 ? sortable.at(i).second
                 : unsortable.at(i - sortable.size()));
        for (int c = 0; c < columnCount(); ++c) {
            QStandardItem *itm = q->child(r, c);
            sorted_children[childIndex(i, c)] = itm;
            if (model) {
                QModelIndex from = model->createIndex(r, c, q);
                if (model->d_func()->persistent.indexes.contains(from)) {
                    QModelIndex to = model->createIndex(i, c, q);
                    changedPersistentIndexesFrom.append(from);
                    changedPersistentIndexesTo.append(to);
                }
            }
        }
    }

    children = sorted_children;

    if (model) {
        model->changePersistentIndexList(changedPersistentIndexesFrom, changedPersistentIndexesTo);
    }

    QList<QStandardItem*>::iterator it;
    for (it = children.begin(); it != children.end(); ++it) {
        if (*it)
            (*it)->d_func()->sortChildren(column, order);
    }
}